

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miscn.c
# Opt level: O1

int OP_miscn(int misc_index,int arg_count)

{
  DLword *pDVar1;
  LispPTR LVar2;
  long lVar3;
  int iVar4;
  DLword *pDVar5;
  uint user_subr_index;
  ulong uVar6;
  bool bVar7;
  
  pDVar5 = MachineState.csp;
  OP_miscn::args[0] = 0;
  if (arg_count < 1) {
    pDVar5 = MachineState.csp + 2;
  }
  else {
    *(LispPTR *)(MachineState.csp + 2) = MachineState.tosvalue;
    pDVar5 = pDVar5 + 4;
    lVar3 = (ulong)(uint)arg_count + 1;
    do {
      pDVar1 = pDVar5 + -2;
      pDVar5 = pDVar5 + -2;
      *(undefined4 *)(&DAT_0015a4a8 + lVar3 * 4) = *(undefined4 *)pDVar1;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  iVar4 = 1;
  switch(misc_index) {
  case 0:
    uVar6 = (ulong)OP_miscn::args[0];
    if ((OP_miscn::args[0] & 0xfff0000) == 0xf0000) {
      user_subr_index = OP_miscn::args[0] | 0xffff0000;
LAB_0012e8fd:
      LVar2 = UserSubr(user_subr_index,arg_count + -1,OP_miscn::args + 1);
      bVar7 = -1 < (int)LVar2;
    }
    else {
      if ((OP_miscn::args[0] & 0xfff0000) == 0xe0000) {
        user_subr_index = OP_miscn::args[0] & 0xffff;
        goto LAB_0012e8fd;
      }
      LVar2 = *(ushort *)((ulong)(OP_miscn::args[0] >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff
      ;
      if ((short)LVar2 == 2) {
        if ((OP_miscn::args[0] & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)OP_miscn::args[0]);
        }
        user_subr_index = *(uint *)(Lisp_world + uVar6);
        goto LAB_0012e8fd;
      }
      bVar7 = false;
    }
    if (!bVar7) {
      return 1;
    }
    break;
  case 1:
    if (0xff < arg_count) {
LAB_0012e7fc:
      error("miscn: arg_count too big! continue punts");
      return 1;
    }
    LVar2 = values(arg_count,OP_miscn::args);
    break;
  case 2:
    LVar2 = SX_hash(OP_miscn::args[0]);
    break;
  default:
    goto switchD_0012e772_caseD_3;
  case 4:
    LVar2 = STRING_HASHBITS(OP_miscn::args[0]);
    break;
  case 5:
    LVar2 = STRING_EQUAL_HASHBITS(OP_miscn::args[0]);
    break;
  case 6:
    if (0xff < arg_count) goto LAB_0012e7fc;
    LVar2 = values_list(arg_count,OP_miscn::args);
    break;
  case 7:
    LVar2 = LCFetchMethod(OP_miscn::args[0],OP_miscn::args[1]);
    goto LAB_0012e86e;
  case 8:
    LVar2 = LCFetchMethodOrHelp(OP_miscn::args[0],OP_miscn::args[1]);
    goto LAB_0012e86e;
  case 9:
    LVar2 = LCFindVarIndex(OP_miscn::args[0],OP_miscn::args[1]);
    goto LAB_0012e86e;
  case 10:
    LVar2 = LCGetIVValue(OP_miscn::args[0],OP_miscn::args[1]);
    goto LAB_0012e86e;
  case 0xb:
    LVar2 = LCPutIVValue(OP_miscn::args[0],OP_miscn::args[1],OP_miscn::args[2]);
LAB_0012e86e:
    if ((int)LVar2 < 0) {
      return (uint)(LVar2 != 0xfffffffe);
    }
    break;
  case 0xc:
    LVar2 = 0;
  }
  MachineState.currentpc = MachineState.currentpc + 3;
  MachineState.csp = pDVar5 + -2;
  iVar4 = 0;
  MachineState.tosvalue = LVar2;
switchD_0012e772_caseD_3:
  return iVar4;
}

Assistant:

int OP_miscn(int misc_index, int arg_count) {
  LispPTR *stk;
  int result;
  static LispPTR args[255];

  /* Put the Args into a Vector */

  args[0] = NIL_PTR;
  stk = ((LispPTR *)(void *)CurrentStackPTR) + 1;

  {
    int arg_num = arg_count;
    if (arg_num > 0) {
      *stk++ = (LispPTR)TopOfStack;
      while (arg_num > 0) args[--arg_num] = *--stk;
    }
  }

  /* Select the Misc Number */

  switch (misc_index) {
    case miscn_USER_SUBR: {
      int user_subr;
      N_GETNUMBER(args[0], user_subr, do_ufn);
      if ((result = UserSubr(user_subr, arg_count - 1, &args[1])) < 0) goto do_ufn;
    } break;
    case miscn_SXHASH: result = SX_hash(args[0]); break;

    case miscn_STRING_EQUAL_HASHBITS: result = STRING_EQUAL_HASHBITS(args[0]); break;

    case miscn_STRINGHASHBITS: result = STRING_HASHBITS(args[0]); break;

    case miscn_VALUES:
      if (arg_count > 255) {
        error("miscn: arg_count too big! continue punts");
        goto do_ufn;
      }
      result = values(arg_count, args);
      break;

    case miscn_VALUES_LIST:
      /*** debugging: should be impossible, but ADB found this once -FS *****/
      if (arg_count > 255) {
        error("miscn: arg_count too big! continue punts");
        goto do_ufn;
      }
      result = values_list(arg_count, args);
      break;

    case miscn_LCFetchMethod:
      result = LCFetchMethod(args[0], args[1]);
      if (result < 0) goto lc_ufn;
      break;

    case miscn_LCFetchMethodOrHelp:
      result = LCFetchMethodOrHelp(args[0], args[1]);
      if (result < 0) goto lc_ufn;
      break;

    case miscn_LCFindVarIndex:
      result = LCFindVarIndex(args[0], args[1]);
      if (result < 0) goto lc_ufn;
      break;

    case miscn_LCGetIVValue:
      result = LCGetIVValue(args[0], args[1]);
      if (result < 0) goto lc_ufn;
      break;

    case miscn_LCPutIVValue:
      result = LCPutIVValue(args[0], args[1], args[2]);
      if (result < 0) goto lc_ufn;
      break;
#ifdef RS232
    case miscn_RAW_RS232C_OPEN:
      if ((result = raw_rs232c_open(args[0])) == NIL) goto do_ufn;

      break;

    case miscn_RAW_RS232C_CLOSE:
      if ((result = raw_rs232c_close(args[0])) == NIL) goto do_ufn;

      break;

    case miscn_RAW_RS232C_SETPARAM:
      if ((result = raw_rs232c_setparams(args[0], args[1])) == NIL) goto do_ufn;
      break;
    case miscn_RAW_RS232C_GETPARAM:
      /******/ break;
    case miscn_RAW_RS232C_READ:
      if ((result = raw_rs232c_read(args[0], args[1], args[2])) == NIL) goto do_ufn;
      break;
    case miscn_RAW_RS232C_WRITE:
      if ((result = raw_rs232c_write(args[0], args[1], args[2])) == NIL) goto do_ufn;
      break;
    case miscn_RAW_RS232C_SETINT:
      if ((result = raw_rs232c_setint(args[0], args[1])) == NIL) goto do_ufn;
      break;
    case miscn_CHATTER: result = chatter(args); break;
#endif /* RS232 */

#ifdef JLISP
    case miscn_EJLISP:
#ifndef NOWNN
      result = ejlisp(args);
#endif
      break;
#endif /* JLISP */

    case /* miscn_CALL_C*/ 014:
      /* result = call_c_fn(args); */
      result = 0;
    break;

    default: goto do_ufn;

  } /* switch end */

  /* Setup Global Machine State for a Normal Return */

  PC += 3;
  CurrentStackPTR = (DLword *)(stk - 1);
  TopOfStack = (LispPTR)result;
  return (0);

/* A UFN request, so return 1 & don't change the Machine State */

do_ufn:
  return (1);
lc_ufn:
  if (result == -2) {
    return (0); /* have built new stack frame */
  } else {
    goto do_ufn;
  }

}